

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agate.cpp
# Opt level: O3

void do_show_save_dialog_proc(Am_Object param_1)

{
  char cVar1;
  ushort uVar2;
  Am_Object *pAVar3;
  Am_Value *pAVar4;
  Am_String *pAVar5;
  Am_Value_List *this;
  Am_Wrapper *pAVar6;
  Am_Constraint *pAVar7;
  Am_Object AVar8;
  Am_Object c;
  Am_Object cancel_button;
  Am_Object save_button;
  Am_Object text_label;
  Am_Object local_80 [2];
  Am_Object local_70;
  Am_Object local_68;
  Am_Object local_60;
  Am_Object local_58;
  Am_Object local_50;
  Am_Object local_48;
  Am_Object local_40;
  Am_Object local_38;
  Am_Object local_30;
  Am_Object local_28;
  Am_Object local_20;
  Am_Object local_18;
  Am_Object local_10;
  
  cVar1 = Am_Object::Valid();
  if (cVar1 == '\0') {
    local_60.data = (Am_Object_Data *)0x0;
    local_68.data = (Am_Object_Data *)0x0;
    local_58.data = (Am_Object_Data *)0x0;
    local_70.data = (Am_Object_Data *)0x0;
    Am_Object::Create((char *)local_80);
    uVar2 = Am_Object::Set((ushort)local_80,100,3);
    uVar2 = Am_Object::Set(uVar2,0x65,0x19);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x66,0xbe);
    Am_Object::operator=(&save_dialog_filename,pAVar3);
    Am_Object::~Am_Object(local_80);
    pAVar4 = (Am_Value *)Am_Object::Get(0x638,0xc5);
    Am_Object::operator=(&local_70,pAVar4);
    Am_Object::Set((ushort)&local_70,(char *)0x150,0x10c3ee);
    Am_Object::Create((char *)local_80);
    uVar2 = Am_Object::Set((ushort)local_80,100,7);
    uVar2 = Am_Object::Set(uVar2,0x65,5);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar2,(char *)0xab,0x10c4b7);
    Am_Object::operator=(&local_58,pAVar3);
    Am_Object::~Am_Object(local_80);
    Am_Object::Create((char *)&local_10);
    Am_Value_List::Am_Value_List((Am_Value_List *)local_80);
    pAVar5 = (Am_String *)Am_Value_List::Add((Am_String *)local_80,0x110648,true);
    this = (Am_Value_List *)Am_Value_List::Add(pAVar5,0x110650,true);
    pAVar6 = Am_Value_List::operator_cast_to_Am_Wrapper_(this);
    uVar2 = Am_Object::Set((ushort)&local_10,(Am_Wrapper *)0xa2,(ulong)pAVar6);
    pAVar7 = Am_Formula::operator_cast_to_Am_Constraint_((Am_Formula *)&Am_Vertical_Layout);
    uVar2 = Am_Object::Set(uVar2,(Am_Constraint *)0x94,(ulong)pAVar7);
    uVar2 = Am_Object::Set(uVar2,100,8);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x65,0x2d);
    Am_Object::operator=(&save_dialog_format,pAVar3);
    Am_Value_List::~Am_Value_List((Am_Value_List *)local_80);
    Am_Object::~Am_Object(&local_10);
    Am_Object::Create((char *)local_80);
    uVar2 = Am_Object::Set((ushort)local_80,100,5);
    uVar2 = Am_Object::Set(uVar2,0x65,100);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x66,0x5c);
    Am_Object::operator=(&local_60,pAVar3);
    Am_Object::~Am_Object(local_80);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_60,0xc5);
    Am_Object::operator=(&local_70,pAVar4);
    uVar2 = Am_Object::Set((ushort)&local_70,(char *)0x150,0x10c5af);
    Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)do_save_file.from_wrapper);
    Am_Object::Create((char *)local_80);
    uVar2 = Am_Object::Set((ushort)local_80,100,0x66);
    uVar2 = Am_Object::Set(uVar2,0x65,100);
    pAVar3 = (Am_Object *)Am_Object::Set(uVar2,0x66,0x5c);
    Am_Object::operator=(&local_68,pAVar3);
    Am_Object::~Am_Object(local_80);
    pAVar4 = (Am_Value *)Am_Object::Get((ushort)&local_68,0xc5);
    Am_Object::operator=(&local_70,pAVar4);
    uVar2 = Am_Object::Set((ushort)&local_70,(char *)0x150,0x10c53d);
    Am_Object::Set(uVar2,(Am_Method_Wrapper *)0xca,(ulong)do_hide_dialog.from_wrapper);
    Am_Object::Create((char *)local_80);
    uVar2 = Am_Object::Set((ushort)local_80,100,100);
    uVar2 = Am_Object::Set(uVar2,0x65,100);
    uVar2 = Am_Object::Set(uVar2,0x66,200);
    uVar2 = Am_Object::Set(uVar2,0x67,0x8c);
    uVar2 = Am_Object::Set(uVar2,(char *)0x6c,0x10c550);
    uVar2 = Am_Object::Set(uVar2,(char *)0x6d,0x10c550);
    pAVar6 = Am_Style::operator_cast_to_Am_Wrapper_((Am_Style *)&Am_Amulet_Purple);
    uVar2 = Am_Object::Set(uVar2,(Am_Wrapper *)0x6a,(ulong)pAVar6);
    AVar8.data = (Am_Object_Data *)Am_Object::Set(uVar2,true,0);
    Am_Object::Am_Object(&local_18,&local_58);
    AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_18,0),1);
    Am_Object::Am_Object(&local_20,&save_dialog_filename);
    AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_20,0),1);
    Am_Object::Am_Object(&local_28,&save_dialog_format);
    AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_28,0),1);
    Am_Object::Am_Object(&local_30,&local_60);
    AVar8.data = (Am_Object_Data *)Am_Object::Add_Part(AVar8,SUB81(&local_30,0),1);
    Am_Object::Am_Object(&local_38,&local_68);
    pAVar3 = (Am_Object *)Am_Object::Add_Part(AVar8,SUB81(&local_38,0),1);
    Am_Object::operator=(&save_dialog,pAVar3);
    Am_Object::~Am_Object(&local_38);
    Am_Object::~Am_Object(&local_30);
    Am_Object::~Am_Object(&local_28);
    Am_Object::~Am_Object(&local_20);
    Am_Object::~Am_Object(&local_18);
    Am_Object::~Am_Object(local_80);
    Am_Object::Am_Object(&local_40,&save_dialog);
    Am_Object::Add_Part((Am_Object_Data *)&Am_Screen,SUB81(&local_40,0),1);
    Am_Object::~Am_Object(&local_40);
    Am_Object::~Am_Object(&local_70);
    Am_Object::~Am_Object(&local_58);
    Am_Object::~Am_Object(&local_68);
    Am_Object::~Am_Object(&local_60);
  }
  Am_Object::Set(0x638,(Am_String *)0x169,0x110588);
  pAVar5 = &classifier_only;
  if (save_with_examples != false) {
    pAVar5 = &classifier_and_examples;
  }
  Am_Object::Set(0x640,(Am_String *)0x169,(ulong)pAVar5);
  Am_Object::Am_Object(&local_48,&save_dialog);
  Am_Object::Am_Object(&local_50,&window);
  Show_Dialog_Centered(&local_48,&local_50);
  Am_Object::~Am_Object(&local_50);
  Am_Object::~Am_Object(&local_48);
  return;
}

Assistant:

Am_Define_Method(Am_Object_Method, void, do_show_save_dialog,
                 (Am_Object /*cmd*/))
{
  if (!save_dialog.Valid()) {
    Am_Object save_button, cancel_button, text_label;
    Am_Object c;
    save_dialog_filename = Am_Text_Input_Widget.Create("save_dialog_filename")
                               .Set(Am_LEFT, 3)
                               .Set(Am_TOP, 25)
                               .Set(Am_WIDTH, 190);
    c = save_dialog_filename.Get(Am_COMMAND);
    c.Set(Am_LABEL, "")
        //.Set(Am_DO_METHOD, do_save_file)
        ;
    text_label = Am_Text.Create("save_dialog_label")
                     .Set(Am_LEFT, 7)
                     .Set(Am_TOP, 5)
                     .Set(Am_TEXT, "Filename:");
    save_dialog_format = Am_Radio_Button_Panel.Create("save_dialog_format")
                             .Set(Am_ITEMS, Am_Value_List()
                                                .Add(classifier_and_examples)
                                                .Add(classifier_only))
                             .Set(Am_LAYOUT, Am_Vertical_Layout)
                             .Set(Am_LEFT, 8)
                             .Set(Am_TOP, 45);
    save_button = Am_Button.Create("save_dialog_save_button")
                      .Set(Am_LEFT, 5)
                      .Set(Am_TOP, 100)
                      .Set(Am_WIDTH, 92);
    c = save_button.Get(Am_COMMAND);
    c.Set(Am_LABEL, "Save").Set(Am_DO_METHOD, do_save_file);
    cancel_button = Am_Button.Create("save_dialog_cancel_button")
                        .Set(Am_LEFT, 102)
                        .Set(Am_TOP, 100)
                        .Set(Am_WIDTH, 92);
    c = cancel_button.Get(Am_COMMAND);
    c.Set(Am_LABEL, "Cancel").Set(Am_DO_METHOD, do_hide_dialog);
    save_dialog = Am_Window.Create("save_dialog")
                      .Set(Am_LEFT, 100)
                      .Set(Am_TOP, 100)
                      .Set(Am_WIDTH, 200)
                      .Set(Am_HEIGHT, 140)
                      .Set(Am_TITLE, "Save Classifier")
                      .Set(Am_ICON_TITLE, "Save Classifier")
                      .Set(Am_FILL_STYLE, Am_Amulet_Purple)
                      .Set(Am_VISIBLE, false)
                      .Add_Part(text_label)
                      .Add_Part(save_dialog_filename)
                      .Add_Part(save_dialog_format)
                      .Add_Part(save_button)
                      .Add_Part(cancel_button);
    Am_Screen.Add_Part(save_dialog);
  }

  // save the current filename
  save_dialog_filename.Set(Am_VALUE, current_filename);
  save_dialog_format.Set(Am_VALUE, save_with_examples ? classifier_and_examples
                                                      : classifier_only);

  Show_Dialog_Centered(save_dialog, window);
}